

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O2

void __thiscall
bssl::HPKETest_SenderInvalidOpen_Test::TestBody(HPKETest_SenderInvalidOpen_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *expected_predicate_value;
  size_t cleartext_len;
  AssertHelper local_480;
  Message local_478;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  size_t enc_len;
  uint8_t kMockCiphertext [100];
  uint8_t cleartext [128];
  uint8_t enc [32];
  uint8_t public_key_r [32];
  uint8_t secret_key_r [32];
  ScopedEVP_HPKE_CTX sender_ctx;
  
  kMockCiphertext[8] = '\0';
  kMockCiphertext[9] = '\0';
  kMockCiphertext[10] = '\0';
  kMockCiphertext[0xb] = '\0';
  kMockCiphertext[0xc] = '\0';
  kMockCiphertext[0xd] = '\0';
  kMockCiphertext[0xe] = '\0';
  kMockCiphertext[0xf] = '\0';
  kMockCiphertext[0x50] = '\0';
  kMockCiphertext[0x51] = '\0';
  kMockCiphertext[0x52] = '\0';
  kMockCiphertext[0x53] = '\0';
  kMockCiphertext[0x54] = '\0';
  kMockCiphertext[0x55] = '\0';
  kMockCiphertext[0x56] = '\0';
  kMockCiphertext[0x57] = '\0';
  kMockCiphertext[0x58] = '\0';
  kMockCiphertext[0x59] = '\0';
  kMockCiphertext[0x5a] = '\0';
  kMockCiphertext[0x5b] = '\0';
  kMockCiphertext[0x5c] = '\0';
  kMockCiphertext[0x5d] = '\0';
  kMockCiphertext[0x5e] = '\0';
  kMockCiphertext[0x5f] = '\0';
  kMockCiphertext[0x40] = '\0';
  kMockCiphertext[0x41] = '\0';
  kMockCiphertext[0x42] = '\0';
  kMockCiphertext[0x43] = '\0';
  kMockCiphertext[0x44] = '\0';
  kMockCiphertext[0x45] = '\0';
  kMockCiphertext[0x46] = '\0';
  kMockCiphertext[0x47] = '\0';
  kMockCiphertext[0x48] = '\0';
  kMockCiphertext[0x49] = '\0';
  kMockCiphertext[0x4a] = '\0';
  kMockCiphertext[0x4b] = '\0';
  kMockCiphertext[0x4c] = '\0';
  kMockCiphertext[0x4d] = '\0';
  kMockCiphertext[0x4e] = '\0';
  kMockCiphertext[0x4f] = '\0';
  kMockCiphertext[0x30] = '\0';
  kMockCiphertext[0x31] = '\0';
  kMockCiphertext[0x32] = '\0';
  kMockCiphertext[0x33] = '\0';
  kMockCiphertext[0x34] = '\0';
  kMockCiphertext[0x35] = '\0';
  kMockCiphertext[0x36] = '\0';
  kMockCiphertext[0x37] = '\0';
  kMockCiphertext[0x38] = '\0';
  kMockCiphertext[0x39] = '\0';
  kMockCiphertext[0x3a] = '\0';
  kMockCiphertext[0x3b] = '\0';
  kMockCiphertext[0x3c] = '\0';
  kMockCiphertext[0x3d] = '\0';
  kMockCiphertext[0x3e] = '\0';
  kMockCiphertext[0x3f] = '\0';
  kMockCiphertext[0x20] = '\0';
  kMockCiphertext[0x21] = '\0';
  kMockCiphertext[0x22] = '\0';
  kMockCiphertext[0x23] = '\0';
  kMockCiphertext[0x24] = '\0';
  kMockCiphertext[0x25] = '\0';
  kMockCiphertext[0x26] = '\0';
  kMockCiphertext[0x27] = '\0';
  kMockCiphertext[0x28] = '\0';
  kMockCiphertext[0x29] = '\0';
  kMockCiphertext[0x2a] = '\0';
  kMockCiphertext[0x2b] = '\0';
  kMockCiphertext[0x2c] = '\0';
  kMockCiphertext[0x2d] = '\0';
  kMockCiphertext[0x2e] = '\0';
  kMockCiphertext[0x2f] = '\0';
  kMockCiphertext[0x10] = '\0';
  kMockCiphertext[0x11] = '\0';
  kMockCiphertext[0x12] = '\0';
  kMockCiphertext[0x13] = '\0';
  kMockCiphertext[0x14] = '\0';
  kMockCiphertext[0x15] = '\0';
  kMockCiphertext[0x16] = '\0';
  kMockCiphertext[0x17] = '\0';
  kMockCiphertext[0x18] = '\0';
  kMockCiphertext[0x19] = '\0';
  kMockCiphertext[0x1a] = '\0';
  kMockCiphertext[0x1b] = '\0';
  kMockCiphertext[0x1c] = '\0';
  kMockCiphertext[0x1d] = '\0';
  kMockCiphertext[0x1e] = '\0';
  kMockCiphertext[0x1f] = '\0';
  kMockCiphertext[0x60] = '\0';
  kMockCiphertext[0x61] = '\0';
  kMockCiphertext[0x62] = '\0';
  kMockCiphertext[99] = '\0';
  kMockCiphertext[0] = 0xff;
  kMockCiphertext[1] = '\0';
  kMockCiphertext[2] = '\0';
  kMockCiphertext[3] = '\0';
  kMockCiphertext[4] = '\0';
  kMockCiphertext[5] = '\0';
  kMockCiphertext[6] = '\0';
  kMockCiphertext[7] = '\0';
  X25519_keypair(public_key_r,secret_key_r);
  EVP_HPKE_CTX_zero(&sender_ctx.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  iVar1 = EVP_HPKE_CTX_setup_sender
                    (&sender_ctx.ctx_,enc,&enc_len,0x20,kem,kdf,aead,public_key_r,0x20,
                     (uint8_t *)0x0,0);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)cleartext,(internal *)&gtest_ar_,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0)"
               ,"false","true",(char *)kdf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cleartext_len,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x234,(char *)cleartext._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&cleartext_len,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cleartext_len);
    std::__cxx11::string::~string((string *)cleartext);
    local_478.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._1_7_ = gtest_ar__1._1_7_;
    local_478.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = gtest_ar__1.success_;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    expected_predicate_value = &DAT_00000050;
    iVar1 = EVP_HPKE_CTX_open(&sender_ctx.ctx_,cleartext,&cleartext_len,0x80,kMockCiphertext,0x50,
                              (uint8_t *)0x0,0);
    this_00 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar1 == 0;
    if (gtest_ar__1.success_) goto LAB_002c3d58;
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "EVP_HPKE_CTX_open(sender_ctx.get(), cleartext, &cleartext_len, sizeof(cleartext), kMockCiphertext, kMockCiphertextLen, nullptr, 0)"
               ,"true","false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x23b,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_478.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)local_478.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_002c3d58:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
  ~StackAllocated(&sender_ctx);
  return;
}

Assistant:

TEST(HPKETest, SenderInvalidOpen) {
  const uint8_t kMockCiphertext[100] = {0xff};
  const size_t kMockCiphertextLen = 80;

  // Generate the recipient's keypair.
  uint8_t secret_key_r[X25519_PRIVATE_KEY_LEN];
  uint8_t public_key_r[X25519_PUBLIC_VALUE_LEN];
  X25519_keypair(public_key_r, secret_key_r);

  // Set up the sender.
  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN];
  size_t enc_len;
  ASSERT_TRUE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0));

  // Call Open() on the sender.
  uint8_t cleartext[128];
  size_t cleartext_len;
  ASSERT_FALSE(EVP_HPKE_CTX_open(sender_ctx.get(), cleartext, &cleartext_len,
                                 sizeof(cleartext), kMockCiphertext,
                                 kMockCiphertextLen, nullptr, 0));
}